

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder.cpp
# Opt level: O0

void __thiscall
RenX_LadderPlugin::RenX_OnGameOver
          (RenX_LadderPlugin *this,Server *server,WinType winType,TeamType *team,int gScore,
          int nScore)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  Server *pSVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  __sv_type local_a0;
  allocator<char> local_79;
  string local_78 [32];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  __sv_type local_48;
  undefined1 local_31;
  int local_30;
  int iStack_2c;
  char chr;
  int nScore_local;
  int gScore_local;
  TeamType *team_local;
  Server *pSStack_18;
  WinType winType_local;
  Server *server_local;
  RenX_LadderPlugin *this_local;
  
  local_30 = nScore;
  iStack_2c = gScore;
  _nScore_local = team;
  team_local._4_4_ = winType;
  pSStack_18 = server;
  server_local = (Server *)this;
  uVar1 = RenX::Server::isRanked();
  if (((uVar1 & 1) != 0) && (uVar1 = RenX::Server::isReliable(), (uVar1 & 1) != 0)) {
    sVar2 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                      ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                       (pSStack_18 + 0x10));
    sVar3 = RenX::Server::getBotCount();
    if (sVar2 != sVar3) {
      local_31 = (undefined1)*_nScore_local;
      pSVar4 = pSStack_18 + 0x70;
      local_48 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&this->field_0x18);
      uVar5 = Jupiter::Config::operator[](pSVar4,local_48._M_len,local_48._M_str);
      local_58 = sv("t",1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,&local_31,1,&local_79);
      Jupiter::Config::set(uVar5,local_58._M_len,local_58._M_str,local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
      pSVar4 = pSStack_18 + 0x70;
      local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&this->field_0x18);
      uVar5 = Jupiter::Config::operator[](pSVar4,local_a0._M_len,local_a0._M_str);
      local_b0 = sv("w",1);
      s_abi_cxx11_(&local_d0,"1",1);
      Jupiter::Config::set(uVar5,local_b0._M_len,local_b0._M_str,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      RenX::Server::updateClientList();
    }
  }
  return;
}

Assistant:

void RenX_LadderPlugin::RenX_OnGameOver(RenX::Server &server, RenX::WinType winType, const RenX::TeamType &team, int gScore, int nScore) {
	if (server.isRanked() && server.isReliable() && server.players.size() != server.getBotCount()) {
		char chr = static_cast<char>(team);
		server.varData[this->name].set("t"sv, std::string(&chr, 1));
		server.varData[this->name].set("w"sv, "1"s);
		server.updateClientList();
	}
}